

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.h
# Opt level: O0

void __thiscall runner::operator()(runner *this)

{
  bool bVar1;
  int iVar2;
  char *__command;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  char *in_stack_ffffffffffffffe8;
  
  bVar1 = std::operator!=(in_RDI,in_stack_ffffffffffffffe8);
  if (bVar1) {
    __command = (char *)std::__cxx11::string::c_str();
    iVar2 = system(__command);
    run_ok = iVar2 == 0;
    cppcms::service::shutdown();
  }
  return;
}

Assistant:

void operator()() const
	{
		if(command_ != "none") {
			run_ok = ::system(command_.c_str()) == 0;
			srv_->shutdown();	
		}
	}